

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curve.h
# Opt level: O0

Vector * __thiscall
anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>::point_at
          (Vector *__return_storage_ptr__,
          Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *this,double t)

{
  element_type *peVar1;
  shared_ptr<anurbs::NurbsCurveGeometry<3L>_> local_30;
  double local_20;
  double t_local;
  Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *this_local;
  
  local_20 = t;
  t_local = (double)this;
  this_local = (Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *)__return_storage_ptr__;
  Ref<anurbs::NurbsCurveGeometry<3L>_>::operator->
            ((Ref<anurbs::NurbsCurveGeometry<3L>_> *)&local_30);
  peVar1 = std::
           __shared_ptr_access<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_30);
  (*(peVar1->super_CurveBase<3L>)._vptr_CurveBase[5])(local_20,__return_storage_ptr__);
  std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>::~shared_ptr(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Vector point_at(const double t) const override
    {
        return m_curve_geometry->point_at(t);
    }